

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

double * seasdummy(double *x,int N,int f,int *rows,int *cols)

{
  size_t __size;
  double dVar1;
  uint N_00;
  void *__ptr;
  void *__ptr_00;
  double *A;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double *__dest;
  double dVar11;
  double dVar12;
  
  if (1 < f) {
    uVar7 = (ulong)(uint)f;
    __size = (long)N * 8;
    __ptr = malloc(__size);
    __ptr_00 = malloc(uVar7 * (long)N * 0x10);
    N_00 = f - 1;
    A = (double *)malloc(__size * N_00);
    uVar10 = (ulong)(uint)N;
    if (0 < N) {
      uVar2 = 0;
      do {
        uVar5 = uVar2 + 1;
        *(double *)((long)__ptr + uVar2 * 8) = (double)(uVar5 & 0xffffffff);
        uVar2 = uVar5;
      } while (uVar10 != uVar5);
    }
    if (0 < N) {
      uVar2 = 1;
      if (1 < f) {
        uVar2 = uVar7;
      }
      lVar3 = (long)__ptr_00 + 8;
      lVar9 = 0;
      uVar5 = 0;
      do {
        dVar1 = *(double *)((long)__ptr + uVar5 * 8);
        lVar4 = 0;
        iVar6 = 1;
        lVar8 = lVar9;
        do {
          dVar11 = ((double)iVar6 * 6.283185307179586 * dVar1) / (double)f;
          dVar12 = sin(dVar11);
          *(double *)(lVar3 + lVar4) = dVar12;
          dVar11 = cos(dVar11);
          *(double *)((long)__ptr_00 + (lVar8 >> 0x1d)) = dVar11;
          iVar6 = iVar6 + 1;
          lVar4 = lVar4 + 0x10;
          lVar8 = lVar8 + 0x200000000;
        } while (uVar2 * 0x10 != lVar4);
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + uVar7 * 0x10;
        lVar9 = lVar9 + (uVar7 << 0x21);
      } while (uVar5 != uVar10);
    }
    printf("PIVAL %g",0x400921fb54442d18);
    if (0 < N) {
      uVar7 = 0;
      __dest = A;
      do {
        memcpy(__dest,(void *)((long)__ptr_00 + uVar7 * 8),(ulong)N_00 * 8);
        __dest = __dest + (int)N_00;
        uVar7 = (ulong)(uint)((int)uVar7 + f * 2);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    itranspose(A,N,N_00);
    *rows = N_00;
    *cols = N;
    free(__ptr);
    free(__ptr_00);
    return A;
  }
  puts("Non-Seasonal Data ");
  exit(-1);
}

Assistant:

double* seasdummy(double *x, int N,int f,int *rows, int *cols) {
    int i,j,iter;
    double *tt;
    double *fmatrix,*oup;
    if ( f <= 1) {
        printf("Non-Seasonal Data \n");
        exit(-1);
    }

    tt = (double*) malloc(sizeof(double)*N);
    fmatrix = (double*)malloc(sizeof(double)*N*2*f);
    oup = (double*)malloc(sizeof(double)*N*(f-1));

    for(i = 0; i < N;++i) {
        tt[i] = (double) i + 1;
    }

    for(i = 0; i < N; ++i) {
        iter = i * 2 * f;
        for(j = 1; j <= f; ++j) {
            fmatrix[iter + 2 * j - 1 ] = sin(2 * (double) PIVAL * j * tt[i] / (double) f);
            fmatrix[iter + 2 * (j - 1) ] = cos(2 * (double) PIVAL * j * tt[i] /(double) f);
            //printf("%d %d \n",iter + 2 * j,iter + 2 * j+1);
        }
    }

    printf("PIVAL %g",PIVAL);

    //mdisplay(fmatrix,N,2*f);

    for(i = 0; i < N;++i) {
        memcpy(oup + i * (f-1),fmatrix + i * 2 * f,sizeof(double)* (f-1));
    }

    itranspose(oup,N,f-1);

    *rows = f-1;
    *cols = N;

    free(tt);
    free(fmatrix);
    return oup;
}